

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.h
# Opt level: O2

Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> __thiscall
kj::MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl>::lockExclusive
          (MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *this,Mutex *param_2)

{
  Impl *extraout_RDX;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> LVar1;
  
  _::Mutex::lock(param_2,0);
  *(Mutex **)&this->mutex = param_2;
  (this->mutex).waitersHead.ptr = (Waiter *)(param_2 + 1);
  LVar1.ptr = extraout_RDX;
  LVar1.mutex = &this->mutex;
  return LVar1;
}

Assistant:

inline Locked<T> MutexGuarded<T>::lockExclusive(LockSourceLocationArg location)
    const {
  mutex.lock(_::Mutex::EXCLUSIVE, kj::none, location);
  return Locked<T>(mutex, value);
}